

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_draw.cpp
# Opt level: O1

void draw_roundtangle_fill
               (Am_Drawonable_Impl *d,int left,int top,int width,int height,int right,int bottom,
               unsigned_short x_radius,unsigned_short y_radius,int thickness,int half_thickness,
               int th2,int corner_width,int corner_height)

{
  short sVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined8 local_70;
  undefined2 local_68 [4];
  undefined2 local_60;
  undefined2 local_5c;
  short local_5a;
  undefined2 local_54;
  short local_50;
  short local_4e;
  undefined2 local_48;
  short local_44;
  undefined2 local_42;
  undefined2 local_3c;
  
  iVar4 = thickness + half_thickness * 2;
  iVar5 = height - corner_height;
  iVar6 = (uint)x_radius - half_thickness;
  iVar2 = left + half_thickness * 2;
  if (0 < iVar5 && (iVar6 != 0 && half_thickness <= (int)(uint)x_radius)) {
    local_70 = (ulong)(uint)left;
    XFillRectangle(d->screen->display,d->xlib_drawable,d->screen->gc,iVar2,(uint)y_radius + top,
                   iVar6,iVar5);
    XFillRectangle(d->screen->display,d->xlib_drawable,d->screen->gc,right - (thickness + iVar6),
                   (uint)y_radius + top,iVar6,iVar5);
    left = (int)local_70;
  }
  iVar5 = top + half_thickness * 2;
  if (0 < height - iVar4 && 0 < width - corner_width) {
    XFillRectangle(d->screen->display,d->xlib_drawable,d->screen->gc,(uint)x_radius + left,iVar5,
                   width - corner_width,height - iVar4);
  }
  if (0 < corner_height - iVar4 && 0 < corner_width - iVar4) {
    sVar1 = (short)half_thickness * 2;
    lVar3 = 10;
    do {
      *(short *)((long)&local_70 + lVar3 + 2) = (short)(corner_width - iVar4);
      *(short *)((long)&local_70 + lVar3 + 4) = (short)(corner_height - iVar4);
      *(undefined2 *)((long)local_68 + lVar3) = 0x1680;
      lVar3 = lVar3 + 0xc;
    } while (lVar3 != 0x3a);
    local_50 = ((short)right + sVar1) - (short)corner_width;
    local_5a = (sVar1 + (short)bottom) - (short)corner_height;
    local_68[0] = (undefined2)iVar2;
    local_68[1] = (undefined2)iVar5;
    local_60 = 0x1680;
    local_54 = 0x2d00;
    local_48 = 0x4380;
    local_3c = 0;
    local_5c = local_68[0];
    local_4e = local_5a;
    local_44 = local_50;
    local_42 = local_68[1];
    XFillArcs(d->screen->display,d->xlib_drawable,d->screen->gc,local_68,4);
  }
  return;
}

Assistant:

void
draw_roundtangle_fill(Am_Drawonable_Impl *d, int left, int top, int width,
                      int height, int right, int bottom,
                      unsigned short x_radius, unsigned short y_radius,
                      int thickness, int half_thickness, int th2,
                      int corner_width, int corner_height)
{
  XArc arc[4];
  // more hackery.  see Draw_Arc for an explanation of why this is necessary.
  // Nov 7 1995 af1x
  int x1_aux = left + 2 * half_thickness;
  int y1_aux = top + 2 * half_thickness;
  int x1_rad = left + x_radius;
  int y1_rad = top + y_radius;
  th2 = thickness + 2 * half_thickness;
  int arc_fill_width = corner_width - th2;
  int arc_fill_height = corner_height - th2;
  int side_fill_width = x_radius - half_thickness;
  int side_fill_height = height - corner_height;
  int middle_fill_width = width - corner_width;
  int middle_fill_height = height - th2;

  if ((side_fill_width > 0) && (side_fill_height > 0)) {
    // Left
    XFillRectangle(d->screen->display, d->xlib_drawable, d->screen->gc, x1_aux,
                   y1_rad, side_fill_width, side_fill_height);
    // Right
    XFillRectangle(d->screen->display, d->xlib_drawable, d->screen->gc,
                   (right - side_fill_width - thickness), y1_rad,
                   side_fill_width, side_fill_height);
  }

  if ((middle_fill_width > 0) && (middle_fill_height > 0)) {
    // Middle
    XFillRectangle(d->screen->display, d->xlib_drawable, d->screen->gc, x1_rad,
                   y1_aux, middle_fill_width, middle_fill_height);
  }

  if ((arc_fill_width > 0) && (arc_fill_height > 0)) {
    int x2_aux = right - corner_width + 2 * half_thickness;
    int y2_aux = bottom - corner_height + 2 * half_thickness;
    for (int i = 0; i < 4; i++) {
      arc[i].width = arc_fill_width;
      arc[i].height = arc_fill_height;
      arc[i].angle2 = Am_90_DEGREES;
    }
    // Top left
    arc[0].x = x1_aux;
    arc[0].y = y1_aux;
    arc[0].angle1 = Am_90_DEGREES;
    // Bottom left
    arc[1].x = x1_aux;
    arc[1].y = y2_aux;
    arc[1].angle1 = Am_180_DEGREES;
    // Bottom right
    arc[2].x = x2_aux;
    arc[2].y = y2_aux;
    arc[2].angle1 = Am_270_DEGREES;
    // Top right
    arc[3].x = x2_aux;
    arc[3].y = y1_aux;
    arc[3].angle1 = Am_0_DEGREES;
    XFillArcs(d->screen->display, d->xlib_drawable, d->screen->gc, arc, 4);
  }
}